

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::ObjFileImporter::CanRead
          (ObjFileImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,checkSig) != 0) {
    bVar1 = BaseImporter::SearchFileHeaderForToken
                      (pIOHandler,pFile,CanRead::pTokens,9,200,false,true);
    return bVar1;
  }
  bVar1 = BaseImporter::SimpleExtensionCheck(pFile,"obj",(char *)0x0,(char *)0x0);
  return bVar1;
}

Assistant:

bool ObjFileImporter::CanRead( const std::string& pFile, IOSystem*  pIOHandler , bool checkSig ) const {
    if(!checkSig)  {
        //Check File Extension
        return SimpleExtensionCheck(pFile,"obj");
    } else {
        // Check file Header
        static const char *pTokens[] = { "mtllib", "usemtl", "v ", "vt ", "vn ", "o ", "g ", "s ", "f " };
        return BaseImporter::SearchFileHeaderForToken(pIOHandler, pFile, pTokens, 9, 200, false, true );
    }
}